

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O3

bool Reflection::get<unsigned_int>(Struct *target,string *name,uint *value,size_t offset)

{
  char *pcVar1;
  char *__s2;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  iterator iVar5;
  string *psVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar7;
  long lVar8;
  long lVar9;
  key_type local_38;
  type_info *type;
  undefined4 extraout_var_02;
  
  iVar3 = (*target->_vptr_Struct[1])();
  __s2 = ___throw_bad_array_new_length;
  type = (type_info *)CONCAT44(extraout_var,iVar3);
  if (type == (type_info *)0x0) {
    return false;
  }
  pcVar1 = *(char **)(type + 8);
  if ((pcVar1 == ___throw_bad_array_new_length) ||
     ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,___throw_bad_array_new_length), iVar3 == 0)))) {
    iVar3 = (*target->_vptr_Struct[5])(target,name);
    uVar4 = *(uint *)(CONCAT44(extraout_var_01,iVar3) + offset * 4);
  }
  else {
    local_38._M_target = type;
    iVar5 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&Enum::names_by_type__abi_cxx11_._M_h,&local_38);
    psVar6 = &Enum::empty_string__abi_cxx11_;
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      psVar6 = (string *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 0x10);
    }
    if (psVar6->_M_string_length == 0) {
      bVar2 = TypeInfo::is_integral(type);
      if (bVar2) {
        bVar2 = TypeInfo::is_signed(type);
        sVar7 = TypeInfo::size(type);
        if (sVar7 < 4 && !bVar2) {
          iVar3 = (*target->_vptr_Struct[5])(target,name);
          lVar8 = CONCAT44(extraout_var_02,iVar3);
          lVar9 = sVar7 * offset;
          pcVar1 = *(char **)(type + 8);
          if ((pcVar1 == ___ostream_insert<wchar_t,std::char_traits<wchar_t>>) ||
             ((*pcVar1 != '*' &&
              (iVar3 = strcmp(pcVar1,___ostream_insert<wchar_t,std::char_traits<wchar_t>>),
              iVar3 == 0)))) {
            *value = (uint)*(byte *)(lVar8 + lVar9);
          }
          if ((pcVar1 == ___libc_single_threaded) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,___libc_single_threaded), iVar3 == 0)))) {
            *value = (int)*(char *)(lVar8 + lVar9);
          }
          if ((pcVar1 == __Rb_tree_decrement) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,__Rb_tree_decrement), iVar3 == 0)))) {
            *value = (uint)*(ushort *)(lVar8 + lVar9);
          }
          if ((pcVar1 == _fopen) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,_fopen), iVar3 == 0)))) {
            *value = (int)*(short *)(lVar8 + lVar9);
          }
          if ((pcVar1 == __s2) || ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,__s2), iVar3 == 0)))) {
            *value = *(uint *)(lVar8 + lVar9);
          }
          if ((pcVar1 == _SDL_DestroyWindow) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,_SDL_DestroyWindow), iVar3 == 0)))) {
            *value = *(uint *)(lVar8 + lVar9);
          }
          if ((pcVar1 == _typeinfo) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,_typeinfo), iVar3 == 0)))) {
            *value = *(uint *)(lVar8 + lVar9);
          }
          if (pcVar1 != ___ostream_insert<char,std::char_traits<char>>) {
            if (*pcVar1 == '*') {
              return true;
            }
            iVar3 = strcmp(pcVar1,___ostream_insert<char,std::char_traits<char>>);
            if (iVar3 != 0) {
              return true;
            }
          }
          uVar4 = *(uint *)(lVar8 + lVar9);
          goto LAB_00429f92;
        }
      }
      return false;
    }
    iVar3 = (*target->_vptr_Struct[5])(target,name);
    uVar4 = *(uint *)CONCAT44(extraout_var_00,iVar3);
  }
LAB_00429f92:
  *value = uVar4;
  return true;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}